

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O2

int amqpvalue_get_encoded_size(AMQP_VALUE value,size_t *encoded_size)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  
  if (value == (AMQP_VALUE)0x0 || encoded_size == (size_t *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_get_encoded_size",0x12a0,1,
                "Bad arguments: value = %p, encoded_size = %p",value,encoded_size);
    }
    return 0x12a1;
  }
  *encoded_size = 0;
  iVar1 = amqpvalue_encode(value,count_bytes,encoded_size);
  return iVar1;
}

Assistant:

int amqpvalue_get_encoded_size(AMQP_VALUE value, size_t* encoded_size)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_309: [If any argument is NULL, amqpvalue_get_encoded_size shall return a non-zero value.] */
    if ((value == NULL) ||
        (encoded_size == NULL))
    {
        LogError("Bad arguments: value = %p, encoded_size = %p",
            value, encoded_size);
        result = MU_FAILURE;
    }
    else
    {
        *encoded_size = 0;
        result = amqpvalue_encode(value, count_bytes, encoded_size);
    }

    return result;
}